

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_class.c
# Opt level: O1

void oonf_class_free(oonf_class *ci,void *ptr)

{
  list_entity *plVar1;
  char *pcVar2;
  
  if ((ci->_free_list_size < ci->min_free_count) || (ci->_free_list_size < ci->_current_usage / 10))
  {
    plVar1 = (ci->_free_list).prev;
    *(list_entity **)ptr = &ci->_free_list;
    *(list_entity **)((long)ptr + 8) = plVar1;
    (ci->_free_list).prev = (list_entity *)ptr;
    plVar1->next = (list_entity *)ptr;
    ci->_free_list_size = ci->_free_list_size + 1;
    pcVar2 = ", reuse";
  }
  else {
    free(ptr);
    pcVar2 = "";
  }
  ci->_current_usage = ci->_current_usage - 1;
  if (((&log_global_mask)[_oonf_class_subsystem.logging] & 1) != 0) {
    oonf_log(1,(ulong)_oonf_class_subsystem.logging,"src/base/oonf_class.c",0xf7,0,0,
             "MEMORY: free %s, %zu bytes%s\n",*(undefined4 *)&ci->name,(int)ci->size,pcVar2);
  }
  return;
}

Assistant:

void
oonf_class_free(struct oonf_class *ci, void *ptr) {
  struct list_entity *item;
#ifdef OONF_LOG_DEBUG_INFO
  bool reuse = false;
#endif

  /*
   * Rather than freeing the memory right away, try to reuse at a later
   * point. Keep at least ten percent of the active used blocks or at least
   * ten blocks on the free list.
   */
  if (ci->_free_list_size < ci->min_free_count || (ci->_free_list_size < ci->_current_usage / 10)) {
    item = ptr;

    list_add_tail(&ci->_free_list, item);

    ci->_free_list_size++;
#ifdef OONF_LOG_DEBUG_INFO
    reuse = true;
#endif
  }
  else {
    /* No interest in reusing memory. */
    free(ptr);
  }

  /* Stats keeping */
  ci->_current_usage--;

  OONF_DEBUG(
    LOG_CLASS, "MEMORY: free %s, %" PRINTF_SIZE_T_SPECIFIER " bytes%s\n", ci->name, ci->size, reuse ? ", reuse" : "");
}